

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subst.c
# Opt level: O2

void add_substitution(bsdtar *bsdtar,char *rule_text)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  subst_rule *psVar4;
  subst_rule *psVar5;
  subst_rule *psVar6;
  char *pcVar7;
  char *pcVar8;
  char *__dest;
  int *piVar9;
  size_t sVar10;
  char buf [80];
  
  psVar4 = (subst_rule *)bsdtar->substitution;
  if (psVar4 == (subst_rule *)0x0) {
    psVar4 = (subst_rule *)calloc(1,0x10);
    bsdtar->substitution = (substitution *)psVar4;
    if (psVar4 != (subst_rule *)0x0) goto LAB_0010d7af;
  }
  else {
LAB_0010d7af:
    psVar5 = (subst_rule *)malloc(0x58);
    if (psVar5 != (subst_rule *)0x0) {
      psVar5->next = (subst_rule *)0x0;
      psVar5->result = (char *)0x0;
      psVar6 = (subst_rule *)(psVar4->re).buffer;
      if (psVar6 == (subst_rule *)0x0) {
        psVar6 = psVar4;
      }
      psVar6->next = psVar5;
      (psVar4->re).buffer = (re_dfa_t *)psVar5;
      if (*rule_text == 0) {
        pcVar7 = "Empty replacement string";
      }
      else {
        pcVar7 = strchr(rule_text + 1,(int)*rule_text);
        if (pcVar7 != (char *)0x0) {
          sVar10 = (long)pcVar7 - (long)rule_text;
          pcVar8 = (char *)malloc(sVar10);
          if (pcVar8 != (char *)0x0) {
            memcpy(pcVar8,rule_text + 1,sVar10 - 1);
            pcVar8[sVar10 - 1] = '\0';
            iVar3 = regcomp((regex_t *)&psVar5->re,pcVar8,0);
            if (iVar3 != 0) {
              regerror(iVar3,(regex_t *)&psVar5->re,buf,0x50);
              lafe_errc(1,0,"Invalid regular expression: %s",buf);
            }
            free(pcVar8);
            pcVar7 = pcVar7 + 1;
            pcVar8 = strchr(pcVar7,(int)*rule_text);
            if (pcVar8 == (char *)0x0) goto LAB_0010d951;
            sVar10 = (long)pcVar8 - (long)pcVar7;
            __dest = (char *)malloc(sVar10 + 1);
            psVar5->result = __dest;
            if (__dest != (char *)0x0) {
              memcpy(__dest,pcVar7,sVar10);
              __dest[sVar10] = '\0';
              bVar2 = psVar5->field_0x50 & 0xc0 | 0x1c;
LAB_0010d8ab:
              do {
                while( true ) {
                  pcVar8 = pcVar8 + 1;
                  psVar5->field_0x50 = bVar2;
                  cVar1 = *pcVar8;
                  if (cVar1 != 'B') break;
LAB_0010d8f9:
                  bVar2 = bVar2 | 0x20;
                }
                if (cVar1 == 'G') {
LAB_0010d8f5:
                  bVar2 = bVar2 | 1;
                  goto LAB_0010d8ab;
                }
                if (cVar1 != 'H') {
                  if (cVar1 != 'P') {
                    if (cVar1 == 'R') {
                      bVar2 = bVar2 & 0xfb;
                      goto LAB_0010d8ab;
                    }
                    if (cVar1 == 'S') {
                      bVar2 = bVar2 & 0xf7;
                      goto LAB_0010d8ab;
                    }
                    if (cVar1 == 'b') goto LAB_0010d8f9;
                    if (cVar1 == 'g') goto LAB_0010d8f5;
                    if (cVar1 == 'h') {
                      bVar2 = bVar2 | 0x10;
                      goto LAB_0010d8ab;
                    }
                    if (cVar1 != 'p') {
                      if (cVar1 == 'r') {
                        bVar2 = bVar2 | 4;
                      }
                      else {
                        if (cVar1 != 's') {
                          if (cVar1 == '\0') {
                            return;
                          }
                          lafe_errc(1,0,"Invalid replacement flag %c",(ulong)(uint)(int)cVar1);
                        }
                        bVar2 = bVar2 | 8;
                      }
                      goto LAB_0010d8ab;
                    }
                  }
                  bVar2 = bVar2 | 2;
                  goto LAB_0010d8ab;
                }
                bVar2 = bVar2 & 0xef;
              } while( true );
            }
          }
          goto LAB_0010d93e;
        }
LAB_0010d951:
        pcVar7 = "Invalid replacement string";
      }
      iVar3 = 0;
      goto LAB_0010d966;
    }
  }
LAB_0010d93e:
  piVar9 = __errno_location();
  iVar3 = *piVar9;
  pcVar7 = "Out of memory";
LAB_0010d966:
  lafe_errc(1,iVar3,pcVar7);
}

Assistant:

void
add_substitution(struct bsdtar *bsdtar, const char *rule_text)
{
	struct subst_rule *rule;
	struct substitution *subst;
	const char *end_pattern, *start_subst;
	char *pattern;
	int r;

	if ((subst = bsdtar->substitution) == NULL) {
		init_substitution(bsdtar);
		subst = bsdtar->substitution;
	}

	rule = malloc(sizeof(*rule));
	if (rule == NULL)
		lafe_errc(1, errno, "Out of memory");
	rule->next = NULL;
	rule->result = NULL;

	if (subst->last_rule == NULL)
		subst->first_rule = rule;
	else
		subst->last_rule->next = rule;
	subst->last_rule = rule;

	if (*rule_text == '\0')
		lafe_errc(1, 0, "Empty replacement string");
	end_pattern = strchr(rule_text + 1, *rule_text);
	if (end_pattern == NULL)
		lafe_errc(1, 0, "Invalid replacement string");

	pattern = malloc(end_pattern - rule_text);
	if (pattern == NULL)
		lafe_errc(1, errno, "Out of memory");
	memcpy(pattern, rule_text + 1, end_pattern - rule_text - 1);
	pattern[end_pattern - rule_text - 1] = '\0';

	if ((r = regcomp(&rule->re, pattern, REG_BASIC)) != 0) {
		char buf[80];
		regerror(r, &rule->re, buf, sizeof(buf));
		lafe_errc(1, 0, "Invalid regular expression: %s", buf);
	}
	free(pattern);

	start_subst = end_pattern + 1;
	end_pattern = strchr(start_subst, *rule_text);
	if (end_pattern == NULL)
		lafe_errc(1, 0, "Invalid replacement string");

	rule->result = malloc(end_pattern - start_subst + 1);
	if (rule->result == NULL)
		lafe_errc(1, errno, "Out of memory");
	memcpy(rule->result, start_subst, end_pattern - start_subst);
	rule->result[end_pattern - start_subst] = '\0';

	/* Defaults */
	rule->global = 0; /* Don't do multiple replacements. */
	rule->print = 0; /* Don't print. */
	rule->regular = 1; /* Rewrite regular filenames. */
	rule->symlink = 1; /* Rewrite symlink targets. */
	rule->hardlink = 1; /* Rewrite hardlink targets. */
	rule->from_begin = 0; /* Don't match from start. */

	while (*++end_pattern) {
		switch (*end_pattern) {
		case 'b':
		case 'B':
			rule->from_begin = 1;
			break;
		case 'g':
		case 'G':
			rule->global = 1;
			break;
		case 'h':
			rule->hardlink = 1;
			break;
		case 'H':
			rule->hardlink = 0;
			break;
		case 'p':
		case 'P':
			rule->print = 1;
			break;
		case 'r':
			rule->regular = 1;
			break;
		case 'R':
			rule->regular = 0;
			break;
		case 's':
			rule->symlink = 1;
			break;
		case 'S':
			rule->symlink = 0;
			break;
		default:
			lafe_errc(1, 0, "Invalid replacement flag %c", *end_pattern);
			/* NOTREACHED */
		}
	}
}